

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

bool __thiscall
trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
::match_conditions(call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
                   *this,call_params_type_t<int_(int,_int)> *params)

{
  list_elem<trompeloeil::condition_base<int_(int,_int)>_> *plVar1;
  int iVar2;
  condition_base<int_(int,_int)> *c;
  
  plVar1 = &(this->conditions).super_list_elem<trompeloeil::condition_base<int_(int,_int)>_>;
  do {
    plVar1 = plVar1->next;
    if (plVar1 == &(this->conditions).super_list_elem<trompeloeil::condition_base<int_(int,_int)>_>)
    break;
    iVar2 = (*plVar1->_vptr_list_elem[2])(plVar1,params);
  } while ((char)iVar2 != '\0');
  return plVar1 == &(this->conditions).super_list_elem<trompeloeil::condition_base<int_(int,_int)>_>
  ;
}

Assistant:

bool
    match_conditions(
      call_params_type_t<Sig> const & params)
    const
    {
      // std::all_of() is almost always preferable. The only reason
      // for using a hand rolled loop is because it cuts compilation
      // times quite noticeably (almost 10% with g++5.1)
      for (auto& c : conditions)
      {
        if (!c.check(params)) return false;
      }
      return true;
    }